

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O2

void edition_unittest::TestNestedMessageHasBits_NestedMessage::MergeImpl
               (MessageLite *to_msg,MessageLite *from_msg)

{
  Nullable<const_char_*> failure_msg;
  TestNestedMessageHasBits_NestedMessage *_this;
  TestNestedMessageHasBits_NestedMessage *local_20;
  MessageLite *local_18 [2];
  
  local_20 = (TestNestedMessageHasBits_NestedMessage *)to_msg;
  local_18[0] = from_msg;
  failure_msg = absl::lts_20250127::log_internal::
                Check_NEImpl<edition_unittest::TestNestedMessageHasBits_NestedMessage_const*,edition_unittest::TestNestedMessageHasBits_NestedMessage*>
                          ((TestNestedMessageHasBits_NestedMessage **)local_18,&local_20,
                           "&from != _this");
  if (failure_msg == (Nullable<const_char_*>)0x0) {
    google::protobuf::RepeatedField<int>::MergeFrom
              (&(local_20->field_0)._impl_.nestedmessage_repeated_int32_,
               (RepeatedField<int> *)(from_msg + 1));
    google::protobuf::RepeatedPtrField<edition_unittest::ForeignMessage>::MergeFrom
              (&(local_20->field_0)._impl_.nestedmessage_repeated_foreignmessage_,
               (RepeatedPtrField<edition_unittest::ForeignMessage> *)
               &from_msg[2]._internal_metadata_);
    google::protobuf::internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
              (&(local_20->super_Message).super_MessageLite._internal_metadata_,
               &from_msg->_internal_metadata_);
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)local_18,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/google/protobuf/edition_unittest.pb.cc"
             ,0x66ab,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_18);
}

Assistant:

void TestNestedMessageHasBits_NestedMessage::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<TestNestedMessageHasBits_NestedMessage*>(&to_msg);
  auto& from = static_cast<const TestNestedMessageHasBits_NestedMessage&>(from_msg);
  // @@protoc_insertion_point(class_specific_merge_from_start:edition_unittest.TestNestedMessageHasBits.NestedMessage)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  _this->_internal_mutable_nestedmessage_repeated_int32()->MergeFrom(from._internal_nestedmessage_repeated_int32());
  _this->_internal_mutable_nestedmessage_repeated_foreignmessage()->MergeFrom(
      from._internal_nestedmessage_repeated_foreignmessage());
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}